

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::resize<>
          (Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *this,size_t size)

{
  ulong local_28;
  size_t i_1;
  size_t i;
  size_t size_local;
  Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *this_local;
  
  if (this->_capacity < size) {
    grow(this,size);
  }
  i_1 = size;
  if (size < this->_size) {
    for (; i_1 < this->_size; i_1 = i_1 + 1) {
    }
  }
  else if (this->_size < size) {
    for (local_28 = this->_size; local_28 < size; local_28 = local_28 + 1) {
      memset(this->_data + local_28,0,0x40);
    }
  }
  this->_size = size;
  return;
}

Assistant:

void Vector<T>::resize(size_t size, ConstructorArgs&&... args)noexcept
{
    if(size > _capacity)
        grow(size);
    if(size < _size) {
        for(size_t i = size; i < _size; i++) {
            _data[i].~T();
        }
    }
    else if(size > _size) {
        for(size_t i = _size; i < size; i++) {
            new (&_data[i]) T(tl::forward<ConstructorArgs>(args)...);
        }
    }
    _size = size;
}